

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O2

bool __thiscall ccs::CcsContext::get<bool>(CcsContext *this,string *propertyName,bool *defaultVal)

{
  bool bVar1;
  bool t;
  string str;
  bool local_31;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  bVar1 = getInto(this,&local_30,propertyName);
  if (bVar1) {
    bVar1 = coerceString<bool>(&local_30,&local_31);
    if (bVar1) {
      defaultVal = &local_31;
    }
  }
  bVar1 = *defaultVal;
  std::__cxx11::string::~string((string *)&local_30);
  return (bool)(bVar1 & 1);
}

Assistant:

T CcsContext::get(const std::string &propertyName, const T &defaultVal) const {
  std::string str;
  if (!getInto(str, propertyName)) return defaultVal;
  T t;
  if (!coerceString(str, t)) return defaultVal;
  return t;
}